

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O0

Inversion * __thiscall
OpenMD::MoleculeCreator::createInversion
          (MoleculeCreator *this,ForceField *ff,Molecule *mol,InversionStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  undefined1 uVar1;
  int index;
  size_type sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  InversionStamp *in_RCX;
  undefined8 in_RDX;
  Atom *in_RSI;
  string *in_stack_000000d8;
  string *in_stack_000000e0;
  string *in_stack_000000e8;
  string *in_stack_000000f0;
  ForceField *in_stack_000000f8;
  string s;
  OpenMDException *e;
  Atom *atomD;
  Atom *atomC;
  Atom *atomB;
  Atom *atomA;
  vector<int,_std::allocator<int>_> satellites;
  int center;
  Inversion *inversion;
  InversionType *inversionType;
  InversionTypeParser itParser;
  Molecule *in_stack_fffffffffffffc88;
  Molecule *in_stack_fffffffffffffc90;
  Inversion *__rhs;
  Inversion *in_stack_fffffffffffffca0;
  InversionType *in_stack_fffffffffffffcd8;
  Atom *in_stack_fffffffffffffce0;
  Atom *in_stack_fffffffffffffce8;
  Atom *in_stack_fffffffffffffcf0;
  Atom *in_stack_fffffffffffffcf8;
  Inversion *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [8];
  InversionTypeParser *in_stack_fffffffffffffde0;
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [96];
  string local_e8 [32];
  Atom *local_c8;
  Atom *local_c0;
  Atom *local_b8;
  Atom *local_b0;
  undefined4 local_a4;
  vector<int,_std::allocator<int>_> local_a0;
  int local_74;
  Inversion *local_70;
  Atom *local_68;
  InversionStamp *local_28;
  undefined8 local_20;
  Atom *local_18;
  Inversion *local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  InversionTypeParser::InversionTypeParser(in_stack_fffffffffffffde0);
  local_68 = (Atom *)0x0;
  local_70 = (Inversion *)0x0;
  local_74 = InversionStamp::getCenter(local_28);
  InversionStamp::getSatellites((InversionStamp *)in_stack_fffffffffffffc88);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_a0);
  if (sVar2 == 3) {
    local_b0 = Molecule::getAtomAt(in_stack_fffffffffffffc90,
                                   (uint)((ulong)in_stack_fffffffffffffc88 >> 0x20));
    std::vector<int,_std::allocator<int>_>::operator[](&local_a0,0);
    local_b8 = Molecule::getAtomAt(in_stack_fffffffffffffc90,
                                   (uint)((ulong)in_stack_fffffffffffffc88 >> 0x20));
    std::vector<int,_std::allocator<int>_>::operator[](&local_a0,1);
    local_c0 = Molecule::getAtomAt(in_stack_fffffffffffffc90,
                                   (uint)((ulong)in_stack_fffffffffffffc88 >> 0x20));
    std::vector<int,_std::allocator<int>_>::operator[](&local_a0,2);
    local_c8 = Molecule::getAtomAt(in_stack_fffffffffffffc90,
                                   (uint)((ulong)in_stack_fffffffffffffc88 >> 0x20));
    uVar1 = InversionStamp::hasOverride(local_28);
    if ((bool)uVar1) {
      InversionStamp::getOverrideType_abi_cxx11_((InversionStamp *)in_stack_fffffffffffffc88);
      InversionStamp::getOverridePars((InversionStamp *)in_stack_fffffffffffffc88);
      local_68 = (Atom *)InversionTypeParser::parseTypeAndPars
                                   ((InversionTypeParser *)CONCAT17(uVar1,in_stack_fffffffffffffd10)
                                    ,in_stack_fffffffffffffd08,
                                    (vector<double,_std::allocator<double>_> *)
                                    in_stack_fffffffffffffd00);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0);
      std::__cxx11::string::~string(local_e8);
    }
    else {
      (*(local_b0->super_StuntDouble)._vptr_StuntDouble[7])(local_148);
      (*(local_b8->super_StuntDouble)._vptr_StuntDouble[7])(local_168);
      (*(local_c0->super_StuntDouble)._vptr_StuntDouble[7])(local_188);
      (*(local_c8->super_StuntDouble)._vptr_StuntDouble[7])(local_1a8);
      in_stack_fffffffffffffce0 =
           (Atom *)ForceField::getInversionType
                             (in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,
                              in_stack_000000e0,in_stack_000000d8);
      local_68 = in_stack_fffffffffffffce0;
      std::__cxx11::string::~string(local_1a8);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_148);
      in_stack_fffffffffffffce8 = local_18;
      if (local_68 == (Atom *)0x0) {
        (*(local_b0->super_StuntDouble)._vptr_StuntDouble[7])(local_1c8);
        in_stack_fffffffffffffcd8 = (InversionType *)std::__cxx11::string::c_str();
        (*(local_b8->super_StuntDouble)._vptr_StuntDouble[7])(local_1e8);
        uVar3 = std::__cxx11::string::c_str();
        (*(local_c0->super_StuntDouble)._vptr_StuntDouble[7])(local_208);
        uVar4 = std::__cxx11::string::c_str();
        (*(local_c8->super_StuntDouble)._vptr_StuntDouble[7])(local_228);
        in_stack_fffffffffffffc88 = (Molecule *)std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "No Matching Inversion Type for[%s, %s, %s, %s]\n\t(May not be a problem: not all inversions are parametrized)\n"
                 ,in_stack_fffffffffffffcd8,uVar3,uVar4);
        std::__cxx11::string::~string(local_228);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string(local_1e8);
        std::__cxx11::string::~string(local_1c8);
        painCave.isFatal = 0;
        painCave.severity = 3;
        simError();
        in_stack_fffffffffffffce8 = local_18;
      }
    }
    if (local_68 == (Atom *)0x0) {
      local_8 = (Inversion *)0x0;
      local_a4 = 1;
    }
    else {
      in_stack_fffffffffffffca0 = (Inversion *)operator_new(0xa0);
      Inversion::Inversion
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                 in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      local_70 = in_stack_fffffffffffffca0;
      index = LocalIndexManager::getNextInversionIndex((LocalIndexManager *)0x1e6006);
      ShortRangeInteraction::setLocalIndex
                (&in_stack_fffffffffffffca0->super_ShortRangeInteraction,index);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              Molecule::getNInversions((Molecule *)0x1e6029);
      OpenMD_itoa_abi_cxx11_((int)((ulong)local_20 >> 0x20),(uint)local_20);
      __rhs = local_70;
      Molecule::getType_abi_cxx11_(in_stack_fffffffffffffc88);
      std::operator+(__lhs,(char *)__rhs);
      std::__cxx11::string::c_str();
      std::operator+(__lhs,(char *)__rhs);
      (*(__rhs->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[3])(__rhs,local_268);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string(local_2a8);
      local_8 = local_70;
      local_a4 = 1;
      std::__cxx11::string::~string(local_248);
    }
  }
  else {
    local_8 = local_70;
    local_a4 = 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0);
  InversionTypeParser::~InversionTypeParser((InversionTypeParser *)0x1e6205);
  return local_8;
}

Assistant:

Inversion* MoleculeCreator::createInversion(
      ForceField* ff, Molecule* mol, InversionStamp* stamp,
      LocalIndexManager* localIndexMan) {
    InversionTypeParser itParser;
    InversionType* inversionType = NULL;
    Inversion* inversion         = NULL;

    int center                  = stamp->getCenter();
    std::vector<int> satellites = stamp->getSatellites();
    if (satellites.size() != 3) { return inversion; }

    Atom* atomA = mol->getAtomAt(center);
    Atom* atomB = mol->getAtomAt(satellites[0]);
    Atom* atomC = mol->getAtomAt(satellites[1]);
    Atom* atomD = mol->getAtomAt(satellites[2]);

    assert(atomA && atomB && atomC && atomD);

    if (stamp->hasOverride()) {
      try {
        inversionType = itParser.parseTypeAndPars(stamp->getOverrideType(),
                                                  stamp->getOverridePars());
      } catch (OpenMDException& e) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MoleculeCreator Error: %s "
                 "for molecule %s\n",
                 e.what(), mol->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }
    } else {
      inversionType = ff->getInversionType(atomA->getType(), atomB->getType(),
                                           atomC->getType(), atomD->getType());

      if (inversionType == NULL) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "No Matching Inversion Type for[%s, %s, %s, %s]\n"
            "\t(May not be a problem: not all inversions are parametrized)\n",
            atomA->getType().c_str(), atomB->getType().c_str(),
            atomC->getType().c_str(), atomD->getType().c_str());

        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
      }
    }
    if (inversionType != NULL) {
      inversion = new Inversion(atomA, atomB, atomC, atomD, inversionType);

      // set the local index of this inversion, the global index will
      // be set later
      inversion->setLocalIndex(localIndexMan->getNextInversionIndex());

      // The rule for naming an inversion is: MoleculeName_Inversion_Integer
      // The first part is the name of the molecule
      // The second part is always fixed as "Inversion"
      // The third part is the index of the inversion defined in meta-data file
      // For example, Benzene_Inversion_0 is a valid Inversion name in a
      // Benzene molecule

      std::string s = OpenMD_itoa(mol->getNInversions(), 10);
      inversion->setName(mol->getType() + "_Inversion_" + s.c_str());
      return inversion;
    } else {
      return NULL;
    }
  }